

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool re2::PCRE::Arg::parse_long_radix(char *str,int n,void *dest,int radix)

{
  char *__nptr;
  int *piVar1;
  long lVar2;
  long r;
  char *end;
  char buf [33];
  int radix_local;
  void *dest_local;
  int n_local;
  char *str_local;
  
  if (n == 0) {
    str_local._7_1_ = false;
  }
  else {
    __nptr = TerminateNumber((char *)&end,str,n);
    piVar1 = __errno_location();
    *piVar1 = 0;
    lVar2 = strtol(__nptr,(char **)&r,radix);
    if ((char *)r == __nptr + n) {
      piVar1 = __errno_location();
      if (*piVar1 == 0) {
        if (dest == (void *)0x0) {
          str_local._7_1_ = true;
        }
        else {
          *(long *)dest = lVar2;
          str_local._7_1_ = true;
        }
      }
      else {
        str_local._7_1_ = false;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  return str_local._7_1_;
}

Assistant:

bool PCRE::Arg::parse_long_radix(const char* str,
                               int n,
                               void* dest,
                               int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, str, n);
  char* end;
  errno = 0;
  long r = strtol(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<long*>(dest)) = r;
  return true;
}